

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall Server::run(Server *this)

{
  fd_set *__writefds;
  int iVar1;
  runtime_error *this_00;
  int *piVar2;
  long *plVar3;
  long *plVar4;
  _List_node_base *p_Var5;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  prepare_sets(this);
  __writefds = &this->wrfds;
  iVar1 = select(this->maxfd + 1,(fd_set *)this,(fd_set *)__writefds,(fd_set *)0x0,(timeval *)0x0);
  if (-1 < iVar1) {
    do {
      if (iVar1 != 0) {
        process_pending_clients(this);
        process_waiting_for_handshake(this);
        process_waiting_for_resolve(this);
        for (p_Var5 = (this->connections).
                      super__List_base<Connection_*,_std::allocator<Connection_*>_>._M_impl._M_node.
                      super__List_node_base._M_next; p_Var5 != (_List_node_base *)&this->connections
            ; p_Var5 = p_Var5->_M_next) {
          Connection::exchange_data((Connection *)p_Var5[1]._M_next,&this->rdfds,__writefds);
        }
      }
      prepare_sets(this);
      iVar1 = select(this->maxfd + 1,(fd_set *)this,(fd_set *)__writefds,(fd_set *)0x0,
                     (timeval *)0x0);
    } while (-1 < iVar1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"select: ","");
  piVar2 = __errno_location();
  strerror(*piVar2);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_48);
  local_68 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_68 == plVar4) {
    local_58 = *plVar4;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar4;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_68);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Server::run() {
    while (true) {
        prepare_sets();
        int selected = select(maxfd + 1, &rdfds, &wrfds, NULL, NULL);
        if (selected < 0) {
            throw std::runtime_error(std::string("select: ") + strerror(errno));
        } else if (selected > 0) {
            process_pending_clients();
            process_waiting_for_handshake();
            process_waiting_for_resolve();
            process_connections();
        }
    }
}